

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServerTestCase.cpp
# Opt level: O0

void __thiscall TestStrategy::TestStrategy(TestStrategy *this)

{
  TestStrategy *this_local;
  
  FIX::SocketServer::Strategy::Strategy(&this->super_Strategy);
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&PTR__TestStrategy_0050b8d8;
  this->connect = 0;
  this->write = 0;
  this->data = 0;
  this->disconnect = 0;
  this->connectSocket = 0;
  this->writeSocket = 0;
  this->dataSocket = 0;
  this->disconnectSocket = 0;
  this->bufLen = 0;
  return;
}

Assistant:

void onConnect(SocketServer &, socket_handle accept, socket_handle socket) {
    connect++;
    connectSocket = socket;
  }